

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.cpp
# Opt level: O3

string_t __thiscall
duckdb::BinaryStrOperator::Operation<duckdb::string_t,duckdb::string_t>
          (BinaryStrOperator *this,string_t input,Vector *result)

{
  byte bVar1;
  byte bVar2;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  undefined1 auVar13 [16];
  string_t sVar14;
  string_t target;
  undefined8 local_38;
  undefined4 *local_30;
  undefined8 local_28;
  long local_20;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  
  local_20 = input.value._0_8_;
  lVar12 = local_20;
  if ((uint)this < 0xd) {
    lVar12 = (long)&local_28 + 4;
  }
  local_28 = this;
  auVar13 = duckdb::StringVector::EmptyString(input.value._8_8_,((ulong)this & 0xffffffff) * 8);
  local_30 = auVar13._8_8_;
  local_38 = auVar13._0_8_;
  uVar9 = auVar13._0_4_;
  if ((uint)this != 0) {
    lVar11 = (long)local_30;
    if (uVar9 < 0xd) {
      lVar11 = (long)&local_38 + 4;
    }
    uVar10 = 0;
    do {
      bVar1 = *(byte *)(lVar12 + uVar10);
      bVar8 = bVar1 >> 1;
      bVar7 = bVar1 >> 2;
      bVar6 = bVar1 >> 3;
      bVar5 = bVar1 >> 4;
      bVar4 = bVar1 >> 5;
      bVar3 = bVar1 >> 6;
      bVar2 = -((char)bVar1 >> 7);
      bVar2 = (bVar2 != 0) * (bVar2 < 0x100) * bVar2 - (0xff < bVar2);
      bVar3 = (bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3);
      bVar4 = (bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4);
      bVar5 = (bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5);
      bVar6 = (bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6);
      bVar7 = (bVar7 != 0) * (bVar7 < 0x100) * bVar7 - (0xff < bVar7);
      bVar8 = (bVar8 != 0) * (bVar8 < 0x100) * bVar8 - (0xff < bVar8);
      bVar1 = (bVar1 != 0) * (bVar1 < 0x100) * bVar1 - (0xff < bVar1);
      *(ulong *)(lVar11 + uVar10 * 8) =
           CONCAT17((bVar1 != 0) * (bVar1 < 0x100) * bVar1 - (0xff < bVar1),
                    CONCAT16((bVar8 != 0) * (bVar8 < 0x100) * bVar8 - (0xff < bVar8),
                             CONCAT15((bVar7 != 0) * (bVar7 < 0x100) * bVar7 - (0xff < bVar7),
                                      CONCAT14((bVar6 != 0) * (bVar6 < 0x100) * bVar6 -
                                               (0xff < bVar6),
                                               CONCAT13((bVar5 != 0) * (bVar5 < 0x100) * bVar5 -
                                                        (0xff < bVar5),
                                                        CONCAT12((bVar4 != 0) * (bVar4 < 0x100) *
                                                                 bVar4 - (0xff < bVar4),
                                                                 CONCAT11((bVar3 != 0) *
                                                                          (bVar3 < 0x100) * bVar3 -
                                                                          (0xff < bVar3),
                                                                          (bVar2 != 0) *
                                                                          (bVar2 < 0x100) * bVar2 -
                                                                          (0xff < bVar2)))))))) &
           0x101010101010101 | 0x3030303030303030;
      uVar10 = uVar10 + 1;
    } while (((ulong)this & 0xffffffff) != uVar10);
    auVar13._8_8_ = local_30;
    auVar13._0_8_ = local_38 & 0xffffffff;
  }
  local_30 = auVar13._8_8_;
  if (auVar13._0_4_ < 0xd) {
    uVar10 = auVar13._0_8_ & 0xffffffff;
    memset((void *)((long)&local_38 + 4 + uVar10),0,0xc - uVar10);
  }
  else {
    local_38 = CONCAT44(*local_30,uVar9);
  }
  sVar14.value.pointer.ptr = (char *)local_30;
  sVar14.value._0_8_ = local_38;
  return (string_t)sVar14.value;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto data = input.GetData();
		auto size = input.GetSize();

		// Allocate empty space
		auto target = StringVector::EmptyString(result, size * 8);
		auto output = target.GetDataWriteable();

		for (idx_t i = 0; i < size; ++i) {
			auto byte = static_cast<uint8_t>(data[i]);
			for (idx_t i = 8; i >= 1; --i) {
				*output = ((byte >> (i - 1)) & 0x01) + '0';
				output++;
			}
		}

		target.Finalize();
		return target;
	}